

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Sled::RS_Sled
          (RS_Sled *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  ChColor local_214;
  ChVector<double> local_208;
  allocator local_1e9;
  string local_1e8 [32];
  ChVector<double> local_1c8;
  MeshShape local_1b0;
  shared_ptr<chrono::ChPhysicsItem> local_150;
  ChQuaternion<double> local_140;
  ChFrame<double> local_120;
  undefined1 local_98 [8];
  ChVector<double> inertia_xy;
  ChVector<double> inertia_xx;
  ChVector<double> com;
  double mass;
  shared_ptr<chrono::ChMaterialSurface> local_38;
  ChSystem *local_28;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *name_local;
  RS_Sled *this_local;
  
  local_28 = system;
  system_local = (ChSystem *)mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_38,mat);
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_38,local_28);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_38);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Sled_002ed8c0;
  (this->super_RS_Part).field_0xec = 1;
  ChVector<double>::ChVector((ChVector<double> *)(inertia_xx.m_data + 2),0.0,0.0,0.146762);
  ChVector<double>::ChVector((ChVector<double> *)(inertia_xy.m_data + 2),0.034856,0.082427,0.105853)
  ;
  ChVector<double>::ChVector((ChVector<double> *)local_98,7e-06,-2e-06,0.0);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChObj::SetIdentifier((ChObj *)peVar2,1);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChBody::SetMass((ChBody *)peVar2,2.768775);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChQuaternion<double>::ChQuaternion(&local_140,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_120,(ChVector<double> *)(inertia_xx.m_data + 2),&local_140);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar2);
  ChFrame<double>::~ChFrame(&local_120);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXX(peVar2);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXY(peVar2);
  pCVar1 = local_28;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBodyAuxRef,void>
            (&local_150,&(this->super_RS_Part).m_body);
  chrono::ChSystem::Add(pCVar1,&local_150);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_150);
  ChVector<double>::ChVector(&local_1c8,0.0,0.0,0.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"robosim_sled_coll",&local_1e9);
  MeshShape::MeshShape
            (&local_1b0,&local_1c8,(ChQuaternion<double> *)&QUNIT,(string *)local_1e8,CONVEX_HULL);
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  push_back(&(this->super_RS_Part).m_meshes,&local_1b0);
  MeshShape::~MeshShape(&local_1b0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::operator=((string *)&(this->super_RS_Part).m_mesh_name,"robosim_sled");
  ChVector<double>::ChVector(&local_208,0.0,0.0,0.0);
  ChVector<double>::operator=(&(this->super_RS_Part).m_offset,&local_208);
  ChColor::ChColor(&local_214,0.7,0.7,0.7);
  ChColor::operator=(&(this->super_RS_Part).m_color,&local_214);
  return;
}

Assistant:

RS_Sled::RS_Sled(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(true) {
    double mass = 2.768775;
    ChVector<> com(0.000000, 0.000000, 0.146762);
    ChVector<> inertia_xx(0.034856, 0.082427, 0.105853);
    ChVector<> inertia_xy(0.000007, -0.000002, 0);

    m_body->SetIdentifier(1);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_meshes.push_back(MeshShape(ChVector<>(0, 0, 0), QUNIT, "robosim_sled_coll", MeshShape::Type::CONVEX_HULL));

    m_mesh_name = "robosim_sled";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.7f, 0.7f, 0.7f);
}